

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void Curl_ssl_associate_conn(Curl_easy *data,connectdata *conn)

{
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((Curl_ssl->associate_connection != (_func__Bool_Curl_easy_ptr_connectdata_ptr_int *)0x0) &&
      ((*Curl_ssl->associate_connection)(data,conn,0), conn->sock[1] != -1)) &&
     ((*(uint *)&(conn->bits).field_0x4 >> 0x1d & 1) != 0)) {
    (*Curl_ssl->associate_connection)(data,conn,1);
  }
  return;
}

Assistant:

void Curl_ssl_associate_conn(struct Curl_easy *data,
                             struct connectdata *conn)
{
  if(Curl_ssl->associate_connection) {
    Curl_ssl->associate_connection(data, conn, FIRSTSOCKET);
    if((conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) &&
       conn->bits.sock_accepted)
      Curl_ssl->associate_connection(data, conn, SECONDARYSOCKET);
  }
}